

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

float64 float64_rem_m68k(float64 a,float64 b,float_status *status)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  byte bVar3;
  byte bVar4;
  float64 fVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  bool bVar21;
  
  if (status->flush_inputs_to_zero != '\0') {
    if ((a & 0xfffffffffffff) != 0 && (a & 0x7ff0000000000000) == 0) {
      a = a & 0x8000000000000000;
      status->float_exception_flags = status->float_exception_flags | 0x40;
    }
    if ((b & 0xfffffffffffff) != 0 && (b & 0x7ff0000000000000) == 0) {
      b = b & 0x8000000000000000;
      status->float_exception_flags = status->float_exception_flags | 0x40;
    }
  }
  uVar12 = a & 0xfffffffffffff;
  uVar6 = (uint)(a >> 0x34) & 0x7ff;
  uVar11 = b & 0xfffffffffffff;
  uVar9 = (uint)(b >> 0x34) & 0x7ff;
  if (uVar6 == 0x7ff) {
    if ((uVar12 == 0) && (uVar11 == 0 || uVar9 != 0x7ff)) {
LAB_006c70f0:
      status->float_exception_flags = status->float_exception_flags | 1;
      return 0x7fffffffffffffff;
    }
LAB_006c6f6a:
    fVar5 = propagateFloat64NaN(a,b,status);
    return fVar5;
  }
  if (uVar9 == 0) {
    if (uVar11 == 0) goto LAB_006c70f0;
    lVar15 = 0x3f;
    if (uVar11 != 0) {
      for (; uVar11 >> lVar15 == 0; lVar15 = lVar15 + -1) {
      }
    }
    uVar9 = ((uint)lVar15 ^ 0x3f) + 0xf5;
    uVar11 = uVar11 << ((byte)uVar9 & 0x3f);
    uVar9 = 1 - (uVar9 & 0xff);
  }
  else if (uVar9 == 0x7ff) {
    if (uVar11 == 0) {
      return a;
    }
    goto LAB_006c6f6a;
  }
  if (uVar6 == 0) {
    if (uVar12 == 0) {
      return a;
    }
    lVar15 = 0x3f;
    if (uVar12 != 0) {
      for (; uVar12 >> lVar15 == 0; lVar15 = lVar15 + -1) {
      }
    }
    uVar6 = ((uint)lVar15 ^ 0x3f) + 0xf5;
    uVar12 = uVar12 << ((byte)uVar6 & 0x3f);
    uVar6 = 1 - (uVar6 & 0xff);
  }
  uVar13 = uVar12 << 0xb | 0x8000000000000000;
  uVar17 = uVar11 << 0xb;
  uVar12 = uVar17 | 0x8000000000000000;
  uVar6 = uVar6 - uVar9;
  if ((int)uVar6 < 0) {
    if (uVar6 != 0xffffffff) {
      return a;
    }
    uVar14 = uVar13 >> 1;
    uVar13 = 0;
LAB_006c7221:
    uVar14 = uVar14 >> 2;
  }
  else {
    uVar14 = 0;
    if (uVar12 <= uVar13) {
      uVar14 = uVar12;
    }
    uVar14 = uVar13 - uVar14;
    iVar16 = uVar6 - 0x40;
    if (uVar6 < 0x41) {
      uVar13 = (ulong)(uVar12 <= uVar13);
    }
    else {
      uVar18 = uVar12 >> 0x20;
      uVar10 = uVar17 & 0xffffffff00000000 | 0x8000000000000000;
      iVar19 = iVar16;
      do {
        uVar7 = 0xffffffffffffffff;
        if (uVar14 < uVar12) {
          uVar13 = 0xffffffff00000000;
          if (uVar14 < uVar10) {
            uVar13 = uVar14 / uVar18 << 0x20;
          }
          uVar8 = (uVar13 >> 0x20) * (uVar17 & 0xffffffff);
          uVar20 = uVar13 * uVar12;
          uVar7 = -uVar20;
          for (lVar15 = ((uVar14 - ((uVar8 >> 0x20) + uVar18 * (uVar13 >> 0x20))) -
                        (ulong)(uVar20 != 0)) - (ulong)(uVar20 < uVar8 << 0x20); lVar15 < 0;
              lVar15 = lVar15 + uVar18 + (ulong)bVar21) {
            uVar13 = uVar13 - 0x100000000;
            bVar21 = CARRY8(uVar7,uVar11 << 0x2b);
            uVar7 = uVar7 + (uVar11 << 0x2b);
          }
          uVar14 = uVar7 >> 0x20 | lVar15 << 0x20;
          uVar7 = 0xffffffff;
          if (uVar14 < uVar10) {
            uVar7 = uVar14 / uVar18;
          }
          uVar7 = uVar7 | uVar13;
        }
        uVar13 = 0;
        if (1 < uVar7) {
          uVar13 = uVar7 - 2;
        }
        uVar14 = -((uVar12 >> 2) * uVar13);
        iVar16 = iVar19 + -0x3e;
        bVar21 = 0x3e < iVar19;
        iVar19 = iVar16;
      } while (bVar21);
    }
    if (iVar16 < -0x3f) goto LAB_006c7221;
    uVar10 = 0xffffffffffffffff;
    if (uVar14 < uVar12) {
      uVar7 = uVar12 >> 0x20;
      uVar18 = uVar17 & 0xffffffff00000000 | 0x8000000000000000;
      uVar13 = 0xffffffff00000000;
      if (uVar14 < uVar18) {
        uVar13 = uVar14 / uVar7 << 0x20;
      }
      uVar10 = (uVar17 & 0xffffffff) * (uVar13 >> 0x20);
      uVar8 = uVar13 * uVar12;
      uVar17 = -uVar8;
      lVar15 = ((uVar14 - ((uVar10 >> 0x20) + (uVar13 >> 0x20) * uVar7)) - (ulong)(uVar8 != 0)) -
               (ulong)(uVar8 < uVar10 << 0x20);
      if (lVar15 < 0) {
        do {
          uVar13 = uVar13 - 0x100000000;
          bVar21 = CARRY8(uVar17,uVar11 << 0x2b);
          uVar17 = uVar17 + (uVar11 << 0x2b);
          lVar15 = lVar15 + uVar7 + (ulong)bVar21;
        } while (lVar15 < 0);
      }
      uVar11 = uVar17 >> 0x20 | lVar15 << 0x20;
      uVar10 = 0xffffffff;
      if (uVar11 < uVar18) {
        uVar10 = uVar11 / uVar7;
      }
      uVar10 = uVar10 | uVar13;
    }
    uVar13 = 0;
    if (1 < uVar10) {
      uVar13 = uVar10 - 2;
    }
    uVar13 = uVar13 >> (-(char)iVar16 & 0x3fU);
    uVar14 = ((uVar14 >> 1) << ((char)iVar16 + 0x3fU & 0x3f)) - uVar13 * (uVar12 >> 2);
  }
  uVar12 = uVar12 >> 2;
  uVar11 = 0xffffffffffffffff;
  if ((long)(uVar14 - uVar12) < -1) {
    uVar11 = uVar14 - uVar12;
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar12;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = ~uVar11 + uVar14;
  uVar11 = SUB168(auVar2 / auVar1,0);
  uVar17 = uVar14 - uVar12 * uVar11;
  uVar14 = ~uVar11 * uVar12 + uVar14;
  lVar15 = uVar14 + uVar17;
  if ((lVar15 < 0) ||
     (bVar3 = 1, lVar15 == 0 && ((int)uVar13 + SUB164(auVar2 / auVar1,0) & 1U) == 0)) {
    bVar3 = (byte)(uVar17 >> 0x38);
    bVar4 = bVar3 >> 7;
    uVar14 = uVar17;
    bVar3 = bVar3 >> 7;
    if (-1 < (long)uVar17) goto LAB_006c7292;
  }
  bVar4 = bVar3;
  uVar17 = -uVar14;
LAB_006c7292:
  if (uVar17 == 0) {
    uVar6 = 0x40;
  }
  else {
    lVar15 = 0x3f;
    if (uVar17 != 0) {
      for (; uVar17 >> lVar15 == 0; lVar15 = lVar15 + -1) {
      }
    }
    uVar6 = (uint)lVar15 ^ 0x3f;
  }
  fVar5 = roundAndPackFloat64(bVar4 ^ (byte)(a >> 0x3f),uVar9 - (uVar6 - 1),
                              uVar17 << ((byte)(uVar6 - 1) & 0x3f),status);
  return fVar5;
}

Assistant:

float64 float64_rem(float64 a, float64 b, float_status *status)
{
    flag aSign, zSign;
    int aExp, bExp, expDiff;
    uint64_t aSig, bSig;
    uint64_t q, alternateASig;
    int64_t sigMean;

    a = float64_squash_input_denormal(a, status);
    b = float64_squash_input_denormal(b, status);
    aSig = extractFloat64Frac( a );
    aExp = extractFloat64Exp( a );
    aSign = extractFloat64Sign( a );
    bSig = extractFloat64Frac( b );
    bExp = extractFloat64Exp( b );
    if ( aExp == 0x7FF ) {
        if ( aSig || ( ( bExp == 0x7FF ) && bSig ) ) {
            return propagateFloat64NaN(a, b, status);
        }
        float_raise(float_flag_invalid, status);
        return float64_default_nan(status);
    }
    if ( bExp == 0x7FF ) {
        if (bSig) {
            return propagateFloat64NaN(a, b, status);
        }
        return a;
    }
    if ( bExp == 0 ) {
        if ( bSig == 0 ) {
            float_raise(float_flag_invalid, status);
            return float64_default_nan(status);
        }
        normalizeFloat64Subnormal( bSig, &bExp, &bSig );
    }
    if ( aExp == 0 ) {
        if ( aSig == 0 ) return a;
        normalizeFloat64Subnormal( aSig, &aExp, &aSig );
    }
    expDiff = aExp - bExp;
    aSig = (aSig | UINT64_C(0x0010000000000000)) << 11;
    bSig = (bSig | UINT64_C(0x0010000000000000)) << 11;
    if ( expDiff < 0 ) {
        if ( expDiff < -1 ) return a;
        aSig >>= 1;
    }
    q = ( bSig <= aSig );
    if ( q ) aSig -= bSig;
    expDiff -= 64;
    while ( 0 < expDiff ) {
        q = estimateDiv128To64( aSig, 0, bSig );
        q = ( 2 < q ) ? q - 2 : 0;
#ifdef _MSC_VER
        aSig = 0ULL - ( ( bSig>>2 ) * q );
#else
        aSig = - ( ( bSig>>2 ) * q );
#endif
        expDiff -= 62;
    }
    expDiff += 64;
    if ( 0 < expDiff ) {
        q = estimateDiv128To64( aSig, 0, bSig );
        q = ( 2 < q ) ? q - 2 : 0;
        q >>= 64 - expDiff;
        bSig >>= 2;
        aSig = ( ( aSig>>1 )<<( expDiff - 1 ) ) - bSig * q;
    }
    else {
        aSig >>= 2;
        bSig >>= 2;
    }
    do {
        alternateASig = aSig;
        ++q;
        aSig -= bSig;
    } while ( 0 <= (int64_t) aSig );
    sigMean = aSig + alternateASig;
    if ( ( sigMean < 0 ) || ( ( sigMean == 0 ) && ( q & 1 ) ) ) {
        aSig = alternateASig;
    }
    zSign = ( (int64_t) aSig < 0 );
#ifdef _MSC_VER
    if ( zSign ) aSig = 0 - aSig;
#else
    if ( zSign ) aSig = - aSig;
#endif
    return normalizeRoundAndPackFloat64(aSign ^ zSign, bExp, aSig, status);

}